

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O2

int CoreMLConverter::getLayerIndex
              (LayerParameter *caffeLayer,
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *mapCaffeLayerNamesToIndex)

{
  const_iterator cVar1;
  mapped_type_conflict1 *pmVar2;
  ostream *poVar3;
  runtime_error *this;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&mapCaffeLayerNamesToIndex->_M_t,(caffeLayer->name_).ptr_);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(mapCaffeLayerNamesToIndex->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_190,"Caffe layer \'");
    poVar3 = std::operator<<(poVar3,(string *)(caffeLayer->name_).ptr_);
    poVar3 = std::operator<<(poVar3,
                             "\' is defined in the .prototxt file but is missing from the the .caffemodel file"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1c0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at(mapCaffeLayerNamesToIndex,(caffeLayer->name_).ptr_);
  if (-1 < *pmVar2) {
    return *pmVar2;
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Utils-inl.hpp"
                ,0xaa,
                "int CoreMLConverter::getLayerIndex(const caffe::LayerParameter &, const std::map<std::string, int> &)"
               );
}

Assistant:

inline int getLayerIndex(const caffe::LayerParameter& caffeLayer,
                                             const std::map<std::string, int>& mapCaffeLayerNamesToIndex) {
        
        
        size_t layerIndexInWeightsFile = 0;
        if (mapCaffeLayerNamesToIndex.find(caffeLayer.name()) != mapCaffeLayerNamesToIndex.end()) {
            int l = mapCaffeLayerNamesToIndex.at(caffeLayer.name());
            assert(l >= 0);
            layerIndexInWeightsFile = static_cast<size_t>(l);
        } else {
            std::stringstream ss;
            ss << "Caffe layer '" << caffeLayer.name()
            << "' is defined in the .prototxt file but is missing from the the .caffemodel file" << std::endl;
            throw std::runtime_error(ss.str());
        }
        assert(layerIndexInWeightsFile <= INT_MAX);
        return static_cast<int>(layerIndexInWeightsFile);
        
    }